

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O2

FT_Error cff_blend_build_vector(CFF_Blend blend,FT_UInt vsindex,FT_UInt lenNDV,FT_Fixed *NDV)

{
  CFF_Font pCVar1;
  FT_Memory memory;
  CFF_VarData *pCVar2;
  CFF_VarRegion *pCVar3;
  CFF_AxisCoords *pCVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  CFF_Blend pCVar10;
  FT_Int32 *pFVar11;
  long b_;
  FT_Long FVar12;
  FT_Fixed *__dest;
  FT_Error FVar13;
  int iVar14;
  uint uVar15;
  long a_;
  long *plVar16;
  long lVar17;
  size_t __n;
  ulong uVar18;
  FT_Error error;
  FT_UInt local_6c;
  long *local_68;
  CFF_Blend local_60;
  ulong local_58;
  FT_Memory local_50;
  CFF_VarData *local_48;
  ulong local_40;
  CFF_Font local_38;
  
  error = 0;
  pCVar1 = blend->font;
  memory = pCVar1->memory;
  blend->builtBV = '\0';
  FVar13 = 3;
  if (((lenNDV == 0) || ((pCVar1->vstore).axisCount == lenNDV)) &&
     (vsindex < (pCVar1->vstore).dataCount)) {
    pCVar2 = (pCVar1->vstore).varData;
    uVar15 = pCVar2[vsindex].regionIdxCount + 1;
    local_6c = vsindex;
    local_68 = NDV;
    pFVar11 = (FT_Int32 *)
              ft_mem_realloc(memory,1,(ulong)blend->lenBV << 2,(ulong)uVar15 * 4,blend->BV,&error);
    blend->BV = pFVar11;
    FVar13 = error;
    if (error == 0) {
      local_48 = pCVar2 + vsindex;
      blend->lenBV = uVar15;
      local_58 = (ulong)lenNDV;
      lVar9 = local_58 * 3;
      local_60 = blend;
      local_50 = memory;
      local_40 = (ulong)uVar15;
      local_38 = pCVar1;
      for (uVar18 = 0; pCVar10 = local_60, uVar18 != local_40; uVar18 = uVar18 + 1) {
        if (uVar18 == 0) {
          *pFVar11 = 0x10000;
        }
        else {
          uVar15 = local_48->regionIndices[uVar18 - 1];
          if ((local_38->vstore).regionCount <= uVar15) {
            return 3;
          }
          if (lenNDV == 0) {
            pFVar11[uVar18] = 0;
          }
          else {
            pCVar3 = (local_38->vstore).varRegionList;
            pFVar11[uVar18] = 0x10000;
            plVar16 = local_68;
            for (lVar17 = 0; lVar9 != lVar17; lVar17 = lVar17 + 3) {
              pCVar4 = pCVar3[uVar15].axisList;
              lVar5 = (&pCVar4->startCoord)[lVar17];
              lVar6 = (&pCVar4->peakCoord)[lVar17];
              iVar14 = 0x10000;
              if (lVar5 <= lVar6) {
                lVar7 = (&pCVar4->endCoord)[lVar17];
                b_ = lVar7 - lVar6;
                if (lVar6 <= lVar7) {
                  if ((lVar6 != 0) && (-1 < lVar5 || lVar7 < 1)) {
                    lVar8 = *plVar16;
                    if (lVar8 < lVar5) {
                      iVar14 = 0;
                    }
                    else {
                      iVar14 = 0;
                      a_ = lVar7 - lVar8;
                      if ((lVar8 <= lVar7) && (iVar14 = 0x10000, lVar8 != lVar6)) {
                        if (lVar8 < lVar6) {
                          b_ = lVar6 - lVar5;
                          a_ = lVar8 - lVar5;
                        }
                        FVar12 = FT_DivFix(a_,b_);
                        iVar14 = (int)FVar12;
                      }
                    }
                  }
                }
              }
              pFVar11 = local_60->BV;
              pFVar11[uVar18] =
                   (FT_Int32)
                   ((ulong)((long)iVar14 * (long)pFVar11[uVar18] +
                            ((long)iVar14 * (long)pFVar11[uVar18] >> 0x3f) + 0x8000) >> 0x10);
              plVar16 = plVar16 + 1;
            }
          }
        }
      }
      local_60->lastVsindex = local_6c;
      if (lenNDV != 0) {
        __n = local_58 << 3;
        __dest = (FT_Fixed *)
                 ft_mem_realloc(local_50,1,(ulong)local_60->lenNDV << 3,__n,local_60->lastNDV,&error
                               );
        pCVar10->lastNDV = __dest;
        if (error != 0) {
          return error;
        }
        memcpy(__dest,local_68,__n);
      }
      pCVar10->lenNDV = lenNDV;
      pCVar10->builtBV = '\x01';
      FVar13 = error;
    }
  }
  return FVar13;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_blend_build_vector( CFF_Blend  blend,
                          FT_UInt    vsindex,
                          FT_UInt    lenNDV,
                          FT_Fixed*  NDV )
  {
    FT_Error   error  = FT_Err_Ok;            /* for FT_REALLOC */
    FT_Memory  memory = blend->font->memory;  /* for FT_REALLOC */

    FT_UInt       len;
    CFF_VStore    vs;
    CFF_VarData*  varData;
    FT_UInt       master;


    FT_ASSERT( lenNDV == 0 || NDV );

    blend->builtBV = FALSE;

    vs = &blend->font->vstore;

    /* VStore and fvar must be consistent */
    if ( lenNDV != 0 && lenNDV != vs->axisCount )
    {
      FT_TRACE4(( " cff_blend_build_vector: Axis count mismatch\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( vsindex >= vs->dataCount )
    {
      FT_TRACE4(( " cff_blend_build_vector: vsindex out of range\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /* select the item variation data structure */
    varData = &vs->varData[vsindex];

    /* prepare buffer for the blend vector */
    len = varData->regionIdxCount + 1;    /* add 1 for default component */
    if ( FT_REALLOC( blend->BV,
                     blend->lenBV * sizeof( *blend->BV ),
                     len * sizeof( *blend->BV ) ) )
      goto Exit;

    blend->lenBV = len;

    /* outer loop steps through master designs to be blended */
    for ( master = 0; master < len; master++ )
    {
      FT_UInt         j;
      FT_UInt         idx;
      CFF_VarRegion*  varRegion;


      /* default factor is always one */
      if ( master == 0 )
      {
        blend->BV[master] = FT_FIXED_ONE;
        FT_TRACE4(( "   build blend vector len %d\n"
                    "   [ %f ",
                    len,
                    blend->BV[master] / 65536.0 ));
        continue;
      }

      /* VStore array does not include default master, so subtract one */
      idx       = varData->regionIndices[master - 1];
      varRegion = &vs->varRegionList[idx];

      if ( idx >= vs->regionCount )
      {
        FT_TRACE4(( " cff_blend_build_vector:"
                    " region index out of range\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      /* Note: `lenNDV' could be zero.                              */
      /*       In that case, build default blend vector (1,0,0...). */
      if ( !lenNDV )
      {
        blend->BV[master] = 0;
        continue;
      }

      /* In the normal case, initialize each component to 1 */
      /* before inner loop.                                 */
      blend->BV[master] = FT_FIXED_ONE; /* default */

      /* inner loop steps through axes in this region */
      for ( j = 0; j < lenNDV; j++ )
      {
        CFF_AxisCoords*  axis = &varRegion->axisList[j];
        FT_Fixed         axisScalar;


        /* compute the scalar contribution of this axis; */
        /* ignore invalid ranges                         */
        if ( axis->startCoord > axis->peakCoord ||
             axis->peakCoord > axis->endCoord   )
          axisScalar = FT_FIXED_ONE;

        else if ( axis->startCoord < 0 &&
                  axis->endCoord > 0   &&
                  axis->peakCoord != 0 )
          axisScalar = FT_FIXED_ONE;

        /* peak of 0 means ignore this axis */
        else if ( axis->peakCoord == 0 )
          axisScalar = FT_FIXED_ONE;

        /* ignore this region if coords are out of range */
        else if ( NDV[j] < axis->startCoord ||
                  NDV[j] > axis->endCoord   )
          axisScalar = 0;

        /* calculate a proportional factor */
        else
        {
          if ( NDV[j] == axis->peakCoord )
            axisScalar = FT_FIXED_ONE;
          else if ( NDV[j] < axis->peakCoord )
            axisScalar = FT_DivFix( NDV[j] - axis->startCoord,
                                    axis->peakCoord - axis->startCoord );
          else
            axisScalar = FT_DivFix( axis->endCoord - NDV[j],
                                    axis->endCoord - axis->peakCoord );
        }

        /* take product of all the axis scalars */
        blend->BV[master] = FT_MulFix( blend->BV[master], axisScalar );
      }

      FT_TRACE4(( ", %f ",
                  blend->BV[master] / 65536.0 ));
    }

    FT_TRACE4(( "]\n" ));

    /* record the parameters used to build the blend vector */
    blend->lastVsindex = vsindex;

    if ( lenNDV != 0 )
    {
      /* user has set a normalized vector */
      if ( FT_REALLOC( blend->lastNDV,
                       blend->lenNDV * sizeof ( *NDV ),
                       lenNDV * sizeof ( *NDV ) ) )
        goto Exit;

      FT_MEM_COPY( blend->lastNDV,
                   NDV,
                   lenNDV * sizeof ( *NDV ) );
    }

    blend->lenNDV  = lenNDV;
    blend->builtBV = TRUE;

  Exit:
    return error;
  }